

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O2

void fielddesc_setcoord(_fielddesc *f,t_template *template,t_word *wp,t_float coord,int loud)

{
  t_float f_00;
  
  if ((f->fd_type == '\x01') && (f->fd_var != '\0')) {
    f_00 = fielddesc_cvtfromcoord(f,coord);
    template_setfloat(template,(f->fd_un).fd_symbol,wp,f_00,loud);
    return;
  }
  if (loud != 0) {
    pd_error((void *)0x0,"attempt to set constant or symbolic data field to a number");
    return;
  }
  return;
}

Assistant:

void fielddesc_setcoord(t_fielddesc *f, t_template *template,
    t_word *wp, t_float coord, int loud)
{
    if (f->fd_type == A_FLOAT && f->fd_var)
    {
        t_float val = fielddesc_cvtfromcoord(f, coord);
        template_setfloat(template,
                f->fd_un.fd_varsym, wp, val, loud);
    }
    else
    {
        if (loud)
            pd_error(0, "attempt to set constant or symbolic data field to a number");
    }
}